

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
ParserValidationErrorTest_Proto2CustomJsonConflictError_Test::TestBody
          (ParserValidationErrorTest_Proto2CustomJsonConflictError_Test *this)

{
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_38
  ;
  string_view local_20;
  ParserValidationErrorTest_Proto2CustomJsonConflictError_Test *local_10;
  ParserValidationErrorTest_Proto2CustomJsonConflictError_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,
             "syntax = \'proto2\';\nmessage TestMessage {\n  optional uint32 foo = 1 [json_name=\'baz\'];\n  optional uint32 bar = 2 [json_name=\'baz\'];\n}\n"
            );
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_38,
            "3:18: The custom JSON name of field \"bar\" (\"baz\") conflicts with the custom JSON name of field \"foo\".\n"
           );
  ParserTest::ExpectHasValidationErrors(&this->super_ParserValidationErrorTest,local_20,&local_38);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_38);
  return;
}

Assistant:

TEST_F(ParserValidationErrorTest, Proto2CustomJsonConflictError) {
  ExpectHasValidationErrors(
      "syntax = 'proto2';\n"
      "message TestMessage {\n"
      "  optional uint32 foo = 1 [json_name='baz'];\n"
      "  optional uint32 bar = 2 [json_name='baz'];\n"
      "}\n",
      "3:18: The custom JSON name of field \"bar\" (\"baz\") conflicts "
      "with the custom JSON name of field \"foo\".\n");
}